

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_bin_ugrid_cell
          (REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_GLOB nnode,FILE *file,
          REF_FILEPOS conn_offset,REF_FILEPOS faceid_offset,REF_BOOL swap_endian,
          REF_BOOL sixty_four_bit)

{
  size_t __size;
  uint node_per;
  REF_MPI ref_mpi;
  undefined1 auVar1 [16];
  FILE *__ptr;
  uint uVar2;
  ulong uVar3;
  clock_t cVar4;
  clock_t cVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  int *__ptr_00;
  REF_INT *part;
  long lVar9;
  int iVar10;
  undefined8 uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long *plVar16;
  REF_INT RVar17;
  ulong uVar18;
  long lVar19;
  FILE *pFVar20;
  long lVar21;
  REF_INT *pRVar22;
  REF_GLOB *pRVar23;
  char *pcVar24;
  uint section_size;
  REF_CELL ref_cell_00;
  size_t __size_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  REF_INT elements_to_receive;
  REF_GLOB *local_120;
  undefined4 *local_118;
  long local_110;
  ulong local_108;
  REF_CELL local_100;
  long local_f8;
  ulong local_f0;
  void *local_e8;
  long local_e0;
  FILE *local_d8;
  REF_GLOB local_d0;
  long local_c8;
  ulong local_c0;
  long *local_b8;
  ulong local_b0;
  REF_NODE local_a8;
  REF_INT total_add;
  REF_INT total_mpi;
  REF_INT total;
  REF_INT end_of_message;
  long local_90;
  long local_88;
  REF_INT *local_80;
  clock_t local_78;
  clock_t local_70;
  clock_t local_68;
  long local_60;
  clock_t local_58;
  ulong local_50;
  REF_FILEPOS local_48;
  size_t local_40;
  long local_38;
  
  ref_mpi = ref_node->ref_mpi;
  end_of_message = -1;
  uVar3 = ncell / (long)ref_mpi->n;
  uVar13 = 1000000;
  if (1000000 < (int)uVar3) {
    uVar13 = uVar3 & 0xffffffff;
  }
  local_d0 = nnode;
  local_a8 = ref_node;
  if ((1 < ref_mpi->timing) && (ref_mpi->id == 0)) {
    printf("chunk %d ncell %ld nproc %d\n",uVar13,ncell);
  }
  uVar2 = ref_cell->size_per * (int)uVar13;
  if ((int)uVar2 < 0) {
    pcVar24 = "malloc sent_c2n of REF_GLOB negative";
    uVar11 = 0x49c;
LAB_001b9124:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar11,
           "ref_part_bin_ugrid_cell",pcVar24);
    return 1;
  }
  node_per = ref_cell->node_per;
  __size_00 = (ulong)uVar2 << 3;
  local_108 = (long)ref_cell->size_per;
  local_d8 = file;
  local_c8 = ncell;
  local_120 = (REF_GLOB *)malloc(__size_00);
  uVar3 = local_108;
  if (local_120 == (REF_GLOB *)0x0) {
    pcVar24 = "malloc sent_c2n of REF_GLOB NULL";
    uVar11 = 0x49c;
  }
  else {
    local_b0 = local_108 & 0xffffffff;
    if (ref_mpi->id != 0) {
      lVar21 = local_d0 + -1;
      local_c8 = local_108 * 8;
      local_f8 = 0;
      local_110 = 0;
      lVar14 = 0;
      local_100 = ref_cell;
      do {
        cVar4 = clock();
        uVar2 = ref_mpi_scatter_recv(ref_mpi,&elements_to_receive,1,1);
        if (uVar2 != 0) {
          pcVar24 = "recv";
          uVar11 = 0x4f6;
          goto LAB_001b99d8;
        }
        cVar5 = clock();
        lVar14 = lVar14 + (cVar5 - cVar4);
        if (0 < elements_to_receive) {
          uVar13 = clock();
          uVar2 = ref_mpi_scatter_recv(ref_mpi,local_120,elements_to_receive * (int)local_108,2);
          if (uVar2 != 0) {
            pcVar24 = "send";
            uVar11 = 0x4fc;
            goto LAB_001b99d8;
          }
          local_e0 = lVar14;
          local_e8 = (void *)clock();
          puVar6 = (undefined4 *)clock();
          RVar17 = elements_to_receive;
          uVar18 = (ulong)(uint)elements_to_receive;
          uVar2 = elements_to_receive * (int)local_b0;
          if ((int)uVar2 < 0) {
            pcVar24 = "malloc sent_part of REF_INT negative";
            uVar11 = 0x501;
            goto LAB_001b9124;
          }
          local_118 = puVar6;
          local_f0 = uVar13;
          local_d8 = (FILE *)malloc((ulong)uVar2 << 2);
          if (local_d8 == (FILE *)0x0) {
            pcVar24 = "malloc sent_part of REF_INT NULL";
            uVar11 = 0x501;
            local_d8 = (FILE *)0x0;
            goto LAB_001b9156;
          }
          if (uVar2 != 0) {
            memset(local_d8,0xff,(ulong)uVar2 << 2);
          }
          __ptr = local_d8;
          if (0 < RVar17) {
            uVar13 = 0;
            pFVar20 = local_d8;
            pRVar23 = local_120;
            do {
              if (0 < (int)node_per) {
                lVar19 = (long)ref_mpi->n;
                lVar14 = (lVar21 + lVar19) / lVar19;
                lVar7 = lVar21 / lVar19;
                lVar19 = local_d0 - lVar7 * lVar19;
                uVar15 = 0;
                do {
                  lVar8 = pRVar23[uVar15] / lVar14;
                  if (lVar19 <= lVar8) {
                    lVar8 = (pRVar23[uVar15] - lVar14 * lVar19) / lVar7 + lVar19;
                  }
                  (&pFVar20->_flags)[uVar15] = (int)lVar8;
                  uVar15 = uVar15 + 1;
                } while (node_per != uVar15);
              }
              uVar13 = uVar13 + 1;
              pRVar23 = (REF_GLOB *)((long)pRVar23 + local_c8);
              pFVar20 = (FILE *)(&pFVar20->_flags + uVar3);
            } while (uVar13 != uVar18);
          }
          uVar2 = ref_cell_add_many_global
                            (local_100,local_a8,RVar17,local_120,&local_d8->_flags,ref_mpi->id);
          if (uVar2 != 0) {
            pcVar24 = "glob";
            uVar11 = 0x50a;
            goto LAB_001b99d8;
          }
          lVar14 = (local_e0 - local_f0) + (long)local_e8;
          free(__ptr);
          cVar4 = clock();
          local_110 = (local_110 - (long)local_118) + cVar4;
        }
        ref_cell_00 = local_100;
      } while (elements_to_receive != -1);
LAB_001b90a6:
      free(local_120);
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell read");
      }
      uVar2 = ref_migrate_shufflin_cell(local_a8,ref_cell_00);
      if (uVar2 == 0) {
        if (ref_mpi->timing < 2) {
          return 0;
        }
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell shuffle");
        if (ref_mpi->timing < 2) {
          return 0;
        }
        total = (REF_INT)lVar14;
        uVar2 = ref_mpi_sum(ref_mpi,&total,&total_mpi,1,1);
        if (uVar2 == 0) {
          total = (REF_INT)local_110;
          uVar2 = ref_mpi_sum(ref_mpi,&total,&total_add,1,1);
          if (uVar2 == 0) {
            if (ref_mpi->id != 0) {
              return 0;
            }
            printf(" read %f mpi %f add %f\n",(double)local_f8 / 1000000.0,
                   ((double)total_mpi / 1000000.0) / (double)ref_mpi->n,
                   ((double)total_add / 1000000.0) / (double)ref_mpi->n);
            return 0;
          }
          uVar11 = 0x51e;
        }
        else {
          uVar11 = 0x51c;
        }
        pcVar24 = "sum";
      }
      else {
        pcVar24 = "fill ghosts";
        uVar11 = 0x515;
      }
LAB_001b99d8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar11
             ,"ref_part_bin_ugrid_cell",(ulong)uVar2,pcVar24);
      return uVar2;
    }
    RVar17 = ref_mpi->n;
    local_48 = conn_offset;
    if ((long)RVar17 < 0) {
      pcVar24 = "malloc elements_to_send of REF_INT negative";
      uVar11 = 0x49f;
      goto LAB_001b9124;
    }
    __size = (long)RVar17 * 4;
    local_100 = ref_cell;
    __ptr_00 = (int *)malloc(__size);
    if (__ptr_00 == (int *)0x0) {
      pcVar24 = "malloc elements_to_send of REF_INT NULL";
      uVar11 = 0x49f;
    }
    else {
      local_118 = (undefined4 *)malloc(__size);
      if (local_118 == (undefined4 *)0x0) {
        pcVar24 = "malloc start_to_send of REF_INT NULL";
        uVar11 = 0x4a0;
      }
      else {
        local_b8 = (long *)malloc(__size_00);
        if (local_b8 == (long *)0x0) {
          pcVar24 = "malloc c2n of REF_GLOB NULL";
          uVar11 = 0x4a1;
        }
        else {
          local_50 = uVar13;
          local_e8 = malloc(uVar13 * 4);
          if (local_e8 != (void *)0x0) {
            if (local_c8 < 1) {
              local_110 = 0;
              lVar14 = 0;
              local_f8 = 0;
            }
            else {
              local_90 = local_d0 + -1;
              local_40 = local_b0 << 3;
              local_88 = local_108 * 8;
              local_38 = local_108 * 4;
              lVar21 = 0;
              local_f8 = 0;
              local_e0 = 0;
              local_110 = 0;
              do {
                uVar3 = local_c8 - lVar21;
                if ((long)local_50 <= local_c8 - lVar21) {
                  uVar3 = local_50;
                }
                local_58 = clock();
                section_size = (uint)uVar3;
                uVar2 = ref_part_bin_ugrid_pack_cell
                                  (local_d8,swap_endian,sixty_four_bit,local_48,faceid_offset,
                                   section_size,lVar21,node_per,(REF_INT)local_108,local_b8);
                if (uVar2 != 0) {
                  pcVar24 = "read c2n";
                  uVar11 = 0x4ac;
                  goto LAB_001b99d8;
                }
                local_60 = lVar21;
                local_68 = clock();
                auVar1 = _DAT_0022ccb0;
                iVar12 = ref_mpi->n;
                lVar21 = (long)iVar12;
                if (0 < (int)section_size) {
                  lVar14 = (local_90 + lVar21) / lVar21;
                  lVar7 = local_d0 - (local_90 / lVar21) * lVar21;
                  uVar13 = 0;
                  plVar16 = local_b8;
                  do {
                    lVar19 = *plVar16 / lVar14;
                    if (lVar7 <= lVar19) {
                      lVar19 = (*plVar16 - lVar14 * lVar7) / (local_90 / lVar21) + lVar7;
                    }
                    *(int *)((long)local_e8 + uVar13 * 4) = (int)lVar19;
                    uVar13 = uVar13 + 1;
                    plVar16 = (long *)((long)plVar16 + local_88);
                  } while ((section_size & 0x7fffffff) != uVar13);
                }
                if (0 < iVar12) {
                  lVar14 = lVar21 + -1;
                  auVar25._8_4_ = (int)lVar14;
                  auVar25._0_8_ = lVar14;
                  auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
                  auVar25 = auVar25 ^ auVar1;
                  lVar14 = 0;
                  auVar29 = _DAT_0022cca0;
                  auVar30 = _DAT_0022ccd0;
                  do {
                    auVar28 = auVar29 ^ auVar1;
                    iVar10 = auVar25._4_4_;
                    if ((bool)(~(auVar28._4_4_ == iVar10 && auVar25._0_4_ < auVar28._0_4_ ||
                                iVar10 < auVar28._4_4_) & 1)) {
                      *(undefined4 *)((long)__ptr_00 + lVar14) = 0;
                    }
                    if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
                        auVar28._12_4_ <= auVar25._12_4_) {
                      *(undefined4 *)((long)__ptr_00 + lVar14 + 4) = 0;
                    }
                    iVar31 = SUB164(auVar30 ^ auVar1,4);
                    if (iVar31 <= iVar10 &&
                        (iVar31 != iVar10 || SUB164(auVar30 ^ auVar1,0) <= auVar25._0_4_)) {
                      *(undefined4 *)((long)__ptr_00 + lVar14 + 8) = 0;
                      *(undefined4 *)((long)__ptr_00 + lVar14 + 0xc) = 0;
                    }
                    lVar7 = auVar29._8_8_;
                    auVar29._0_8_ = auVar29._0_8_ + 4;
                    auVar29._8_8_ = lVar7 + 4;
                    lVar7 = auVar30._8_8_;
                    auVar30._0_8_ = auVar30._0_8_ + 4;
                    auVar30._8_8_ = lVar7 + 4;
                    lVar14 = lVar14 + 0x10;
                  } while ((ulong)(iVar12 + 3U >> 2) << 4 != lVar14);
                }
                if (0 < (int)section_size) {
                  uVar13 = 0;
                  do {
                    __ptr_00[*(int *)((long)local_e8 + uVar13 * 4)] =
                         __ptr_00[*(int *)((long)local_e8 + uVar13 * 4)] + 1;
                    uVar13 = uVar13 + 1;
                  } while ((section_size & 0x7fffffff) != uVar13);
                }
                *local_118 = 0;
                if (1 < iVar12) {
                  lVar14 = 0;
                  iVar10 = 0;
                  do {
                    iVar10 = iVar10 + __ptr_00[lVar14];
                    local_118[lVar14 + 1] = iVar10;
                    lVar14 = lVar14 + 1;
                  } while (lVar21 + -1 != lVar14);
                }
                if (0 < iVar12) {
                  lVar21 = lVar21 + -1;
                  auVar26._8_4_ = (int)lVar21;
                  auVar26._0_8_ = lVar21;
                  auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
                  lVar21 = 0;
                  auVar28 = _DAT_0022cca0;
                  auVar27 = _DAT_0022ccd0;
                  do {
                    auVar29 = auVar26 ^ auVar1;
                    auVar30 = auVar28 ^ auVar1;
                    iVar10 = auVar29._4_4_;
                    if ((bool)(~(iVar10 < auVar30._4_4_ ||
                                auVar29._0_4_ < auVar30._0_4_ && auVar30._4_4_ == iVar10) & 1)) {
                      *(undefined4 *)((long)__ptr_00 + lVar21) = 0;
                    }
                    if (auVar30._12_4_ <= auVar29._12_4_ &&
                        (auVar30._8_4_ <= auVar29._8_4_ || auVar30._12_4_ != auVar29._12_4_)) {
                      *(undefined4 *)((long)__ptr_00 + lVar21 + 4) = 0;
                    }
                    iVar31 = SUB164(auVar27 ^ auVar1,4);
                    if (iVar31 <= iVar10 &&
                        (iVar31 != iVar10 || SUB164(auVar27 ^ auVar1,0) <= auVar29._0_4_)) {
                      *(undefined4 *)((long)__ptr_00 + lVar21 + 8) = 0;
                      *(undefined4 *)((long)__ptr_00 + lVar21 + 0xc) = 0;
                    }
                    lVar14 = auVar28._8_8_;
                    auVar28._0_8_ = auVar28._0_8_ + 4;
                    auVar28._8_8_ = lVar14 + 4;
                    lVar14 = auVar27._8_8_;
                    auVar27._0_8_ = auVar27._0_8_ + 4;
                    auVar27._8_8_ = lVar14 + 4;
                    lVar21 = lVar21 + 0x10;
                  } while ((ulong)(iVar12 + 3U >> 2) << 4 != lVar21);
                }
                local_c0 = uVar3;
                if (0 < (int)section_size) {
                  local_f0 = (ulong)(section_size & 0x7fffffff);
                  uVar18 = 0;
                  uVar13 = 0;
                  uVar3 = local_108;
                  do {
                    iVar12 = *(int *)((long)local_e8 + uVar13 * 4);
                    iVar10 = __ptr_00[iVar12];
                    if (0 < (int)uVar3) {
                      memcpy(local_120 + (local_118[iVar12] + iVar10) * (int)uVar3,local_b8 + uVar18
                             ,local_40);
                      uVar3 = local_108;
                    }
                    __ptr_00[iVar12] = iVar10 + 1;
                    uVar13 = uVar13 + 1;
                    uVar18 = (ulong)(uint)((int)uVar18 + (int)uVar3);
                  } while (local_f0 != uVar13);
                }
                local_f0 = clock();
                puVar6 = local_118;
                iVar12 = ref_mpi->n;
                if (1 < iVar12) {
                  lVar21 = 1;
                  lVar14 = 4;
                  do {
                    if (0 < __ptr_00[lVar21]) {
                      uVar2 = ref_mpi_scatter_send
                                        (ref_mpi,(void *)((long)__ptr_00 + lVar14),1,1,
                                         (REF_INT)lVar21);
                      if (uVar2 != 0) {
                        pcVar24 = "send";
                        uVar11 = 0x4cb;
                        goto LAB_001b99d8;
                      }
                      uVar2 = ref_mpi_scatter_send
                                        (ref_mpi,local_120 +
                                                 (long)(int)local_b0 * (long)(int)puVar6[lVar21],
                                         __ptr_00[lVar21] * (int)local_b0,2,(REF_INT)lVar21);
                      if (uVar2 != 0) {
                        pcVar24 = "send";
                        uVar11 = 0x4cf;
                        goto LAB_001b99d8;
                      }
                      iVar12 = ref_mpi->n;
                    }
                    lVar21 = lVar21 + 1;
                    lVar14 = lVar14 + 4;
                  } while (lVar21 < iVar12);
                }
                cVar4 = clock();
                cVar5 = clock();
                iVar12 = *__ptr_00;
                if (0 < (long)iVar12) {
                  uVar2 = iVar12 * (int)local_108;
                  local_70 = cVar4;
                  if ((int)uVar2 < 0) {
                    pcVar24 = "malloc sent_part of REF_INT negative";
                    uVar11 = 0x4d8;
                    goto LAB_001b9124;
                  }
                  local_78 = cVar5;
                  part = (REF_INT *)malloc((ulong)uVar2 << 2);
                  lVar21 = local_90;
                  if (part == (REF_INT *)0x0) {
                    pcVar24 = "malloc sent_part of REF_INT NULL";
                    uVar11 = 0x4d8;
                    goto LAB_001b9156;
                  }
                  if ((int)local_b0 != 0) {
                    memset(part,0xff,(ulong)(uVar2 + (uVar2 == 0)) << 2);
                  }
                  lVar14 = 0;
                  pRVar22 = part;
                  pRVar23 = local_120;
                  do {
                    if (0 < (int)node_per) {
                      lVar8 = (long)ref_mpi->n;
                      lVar7 = (lVar21 + lVar8) / lVar8;
                      lVar19 = lVar21 / lVar8;
                      lVar8 = local_d0 - lVar19 * lVar8;
                      uVar3 = 0;
                      do {
                        lVar9 = pRVar23[uVar3] / lVar7;
                        if (lVar8 <= lVar9) {
                          lVar9 = (pRVar23[uVar3] - lVar7 * lVar8) / lVar19 + lVar8;
                        }
                        pRVar22[uVar3] = (REF_INT)lVar9;
                        uVar3 = uVar3 + 1;
                      } while (node_per != uVar3);
                    }
                    lVar14 = lVar14 + 1;
                    pRVar23 = (REF_GLOB *)((long)pRVar23 + local_88);
                    pRVar22 = (REF_INT *)((long)pRVar22 + local_38);
                  } while (lVar14 != iVar12);
                  local_80 = part;
                  uVar2 = ref_cell_add_many_global
                                    (local_100,local_a8,iVar12,local_120,part,ref_mpi->id);
                  if (uVar2 != 0) {
                    pcVar24 = "glob";
                    uVar11 = 0x4e1;
                    goto LAB_001b99d8;
                  }
                  free(part);
                  cVar4 = local_70;
                  cVar5 = local_78;
                }
                local_f8 = (local_f8 - local_58) + local_68;
                lVar21 = local_60 + (int)local_c0;
                local_e0 = (local_e0 - local_f0) + cVar4;
                cVar4 = clock();
                local_110 = (local_110 - cVar5) + cVar4;
              } while (lVar21 < local_c8);
              RVar17 = ref_mpi->n;
              lVar14 = local_e0;
            }
            ref_cell_00 = local_100;
            puVar6 = local_118;
            free(local_e8);
            free(local_b8);
            free(puVar6);
            free(__ptr_00);
            if (1 < RVar17) {
              iVar12 = 1;
              do {
                uVar2 = ref_mpi_scatter_send(ref_mpi,&end_of_message,1,1,iVar12);
                if (uVar2 != 0) {
                  pcVar24 = "send";
                  uVar11 = 0x4f0;
                  goto LAB_001b99d8;
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 < ref_mpi->n);
            }
            goto LAB_001b90a6;
          }
          pcVar24 = "malloc dest of REF_INT NULL";
          uVar11 = 0x4a2;
        }
      }
    }
  }
LAB_001b9156:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar11,
         "ref_part_bin_ugrid_cell",pcVar24);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_cell(
    REF_CELL ref_cell, REF_LONG ncell, REF_NODE ref_node, REF_GLOB nnode,
    FILE *file, REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset,
    REF_BOOL swap_endian, REF_BOOL sixty_four_bit) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  clock_t tic;
  clock_t read_toc = 0;
  clock_t mpi_toc = 0;
  clock_t add_toc = 0;

  chunk = MAX(1000000, (REF_INT)(ncell / ref_mpi_n(ref_mpi)));

  if (1 < ref_mpi_timing(ref_mpi) && ref_mpi_once(ref_mpi))
    printf("chunk %d ncell %ld nproc %d\n", chunk, ncell, ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = (REF_INT)MIN((REF_LONG)chunk, ncell - ncell_read);

      tic = clock();
      RSS(ref_part_bin_ugrid_pack_cell(file, swap_endian, sixty_four_bit,
                                       conn_offset, faceid_offset, section_size,
                                       ncell_read, node_per, size_per, c2n),
          "read c2n");
      read_toc += (clock() - tic);
      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }
      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      tic = clock();
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
      mpi_toc += (clock() - tic);
      /* rank 0 keepers */

      tic = clock();
      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }
      add_toc += (clock() - tic);
    }

    ref_free(dest);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      tic = clock();
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      mpi_toc += (clock() - tic);
      if (elements_to_receive > 0) {
        tic = clock();
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");
        mpi_toc += (clock() - tic);

        tic = clock();
        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);
        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
        add_toc += (clock() - tic);
      }
    } while (elements_to_receive != end_of_message);
  }
  free(sent_c2n);

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell read");
  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell shuffle");

  if (1 < ref_mpi_timing(ref_mpi)) {
    REF_INT total, total_mpi, total_add;
    total = (REF_INT)mpi_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_mpi, 1, REF_INT_TYPE), "sum");
    total = (REF_INT)add_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_add, 1, REF_INT_TYPE), "sum");
    if (ref_mpi_once(ref_mpi))
      printf(" read %f mpi %f add %f\n",
             ((REF_DBL)read_toc) / ((REF_DBL)CLOCKS_PER_SEC),
             ((REF_DBL)total_mpi) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)),
             ((REF_DBL)total_add) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)));
  }

  return REF_SUCCESS;
}